

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  undefined4 uVar2;
  uint uVar3;
  Scene *pSVar4;
  Ref<embree::Geometry> *pRVar5;
  Geometry *pGVar6;
  long lVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  long lVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  int iVar23;
  int iVar24;
  byte bVar25;
  ulong *puVar26;
  long lVar27;
  byte bVar28;
  uint uVar29;
  uint uVar30;
  long lVar31;
  ulong uVar32;
  int iVar33;
  ulong uVar34;
  long lVar35;
  ulong uVar36;
  AABBNodeMB4D *node1;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar69 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [64];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined4 uVar101;
  undefined1 auVar102 [32];
  undefined1 auVar103 [64];
  float fVar104;
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar105 [32];
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar119;
  float fVar120;
  float fVar121;
  undefined1 auVar118 [16];
  float fVar122;
  float fVar124;
  float fVar125;
  float fVar126;
  undefined1 auVar123 [32];
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_13a0 [16];
  long local_1390;
  long local_1388;
  ulong local_1380;
  ulong local_1378;
  RTCFilterFunctionNArguments local_1370;
  undefined1 local_1340 [32];
  undefined1 local_1320 [16];
  undefined1 local_1310 [16];
  undefined1 local_1300 [32];
  undefined1 local_12d0 [16];
  undefined1 local_12c0 [16];
  float local_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  float local_12a0;
  float fStack_129c;
  float fStack_1298;
  float fStack_1294;
  float local_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  float local_1280;
  float fStack_127c;
  float fStack_1278;
  float fStack_1274;
  float local_1270;
  float fStack_126c;
  float fStack_1268;
  float fStack_1264;
  float local_1260;
  float fStack_125c;
  float fStack_1258;
  float fStack_1254;
  undefined1 local_1250 [16];
  undefined1 local_1240 [32];
  RTCHitN local_1210 [16];
  undefined1 local_1200 [16];
  undefined1 local_11f0 [16];
  undefined1 local_11e0 [16];
  undefined4 local_11d0;
  undefined4 uStack_11cc;
  undefined4 uStack_11c8;
  undefined4 uStack_11c4;
  undefined1 local_11c0 [16];
  undefined1 local_11b0 [16];
  uint local_11a0;
  uint uStack_119c;
  uint uStack_1198;
  uint uStack_1194;
  uint uStack_1190;
  uint uStack_118c;
  uint uStack_1188;
  uint uStack_1184;
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  byte local_10c0;
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  float local_1040 [4];
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  undefined4 uStack_1024;
  float local_1020 [4];
  float fStack_1010;
  float fStack_100c;
  float fStack_1008;
  uint uStack_1004;
  float local_1000 [4];
  float fStack_ff0;
  float fStack_fec;
  float fStack_fe8;
  uint uStack_fe4;
  undefined1 local_fe0;
  undefined1 local_fc0 [32];
  size_t local_fa0;
  undefined4 uStack_f98;
  ulong local_f90 [492];
  
  puVar26 = local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  local_1310 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar132 = ZEXT1664(local_1310);
  local_1320 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar133 = ZEXT1664(local_1320);
  uVar101 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1250._4_4_ = uVar101;
  local_1250._0_4_ = uVar101;
  local_1250._8_4_ = uVar101;
  local_1250._12_4_ = uVar101;
  auVar103 = ZEXT1664(local_1250);
  fVar117 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar122 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar127 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar104 = fVar117 * 0.99999964;
  fVar109 = fVar122 * 0.99999964;
  fVar113 = fVar127 * 0.99999964;
  fVar117 = fVar117 * 1.0000004;
  fVar122 = fVar122 * 1.0000004;
  fVar127 = fVar127 * 1.0000004;
  uVar36 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_1378 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_1380 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar40 = local_1378 ^ 0x10;
  local_12c0 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar131 = ZEXT1664(local_12c0);
  iVar33 = (tray->tfar).field_0.i[k];
  auVar96 = ZEXT1664(CONCAT412(iVar33,CONCAT48(iVar33,CONCAT44(iVar33,iVar33))));
  uVar38 = local_1380 ^ 0x10;
  local_12d0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  fVar106 = fVar104;
  fVar107 = fVar104;
  fVar108 = fVar104;
  fVar110 = fVar109;
  fVar111 = fVar109;
  fVar112 = fVar109;
  fVar114 = fVar113;
  fVar115 = fVar113;
  fVar116 = fVar113;
  fVar119 = fVar117;
  fVar120 = fVar117;
  fVar121 = fVar117;
  fVar124 = fVar122;
  fVar125 = fVar122;
  fVar126 = fVar122;
  fVar128 = fVar127;
  fVar129 = fVar127;
  fVar130 = fVar127;
  local_12b0 = fVar127;
  fStack_12ac = fVar127;
  fStack_12a8 = fVar127;
  fStack_12a4 = fVar127;
  local_12a0 = fVar122;
  fStack_129c = fVar122;
  fStack_1298 = fVar122;
  fStack_1294 = fVar122;
  local_1290 = fVar117;
  fStack_128c = fVar117;
  fStack_1288 = fVar117;
  fStack_1284 = fVar117;
  local_1280 = fVar113;
  fStack_127c = fVar113;
  fStack_1278 = fVar113;
  fStack_1274 = fVar113;
  local_1270 = fVar109;
  fStack_126c = fVar109;
  fStack_1268 = fVar109;
  fStack_1264 = fVar109;
  local_1260 = fVar104;
  fStack_125c = fVar104;
  fStack_1258 = fVar104;
  fStack_1254 = fVar104;
LAB_006e3fd7:
  while (pfVar1 = (float *)(puVar26 + -1), puVar26 = puVar26 + -2,
        *pfVar1 <= *(float *)(ray + k * 4 + 0x80)) {
    uVar39 = *puVar26;
    while( true ) {
      if ((uVar39 & 8) != 0) {
        local_1390 = (ulong)((uint)uVar39 & 0xf) - 8;
        if (local_1390 == 0) goto LAB_006e5039;
        uVar39 = uVar39 & 0xfffffffffffffff0;
        local_1388 = 0;
        goto LAB_006e4365;
      }
      uVar37 = uVar39 & 0xfffffffffffffff0;
      uVar101 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar54._4_4_ = uVar101;
      auVar54._0_4_ = uVar101;
      auVar54._8_4_ = uVar101;
      auVar54._12_4_ = uVar101;
      auVar42 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar37 + 0x80 + uVar36),auVar54,
                                *(undefined1 (*) [16])(uVar37 + 0x20 + uVar36));
      auVar42 = vsubps_avx512vl(auVar42,auVar132._0_16_);
      auVar43._0_4_ = fVar104 * auVar42._0_4_;
      auVar43._4_4_ = fVar106 * auVar42._4_4_;
      auVar43._8_4_ = fVar107 * auVar42._8_4_;
      auVar43._12_4_ = fVar108 * auVar42._12_4_;
      auVar43 = vmaxps_avx512vl(auVar131._0_16_,auVar43);
      auVar42 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar37 + 0x80 + local_1378),auVar54,
                                *(undefined1 (*) [16])(uVar37 + 0x20 + local_1378));
      auVar42 = vsubps_avx512vl(auVar42,auVar133._0_16_);
      auVar51._0_4_ = fVar109 * auVar42._0_4_;
      auVar51._4_4_ = fVar110 * auVar42._4_4_;
      auVar51._8_4_ = fVar111 * auVar42._8_4_;
      auVar51._12_4_ = fVar112 * auVar42._12_4_;
      auVar42 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar37 + 0x80 + local_1380),auVar54,
                                *(undefined1 (*) [16])(uVar37 + 0x20 + local_1380));
      auVar42 = vsubps_avx(auVar42,auVar103._0_16_);
      auVar60._0_4_ = fVar113 * auVar42._0_4_;
      auVar60._4_4_ = fVar114 * auVar42._4_4_;
      auVar60._8_4_ = fVar115 * auVar42._8_4_;
      auVar60._12_4_ = fVar116 * auVar42._12_4_;
      auVar42 = vmaxps_avx(auVar51,auVar60);
      auVar42 = vmaxps_avx(auVar43,auVar42);
      auVar43 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar37 + 0x80 + (uVar36 ^ 0x10)),auVar54,
                                *(undefined1 (*) [16])(uVar37 + 0x20 + (uVar36 ^ 0x10)));
      auVar43 = vsubps_avx512vl(auVar43,auVar132._0_16_);
      auVar57._0_4_ = fVar117 * auVar43._0_4_;
      auVar57._4_4_ = fVar119 * auVar43._4_4_;
      auVar57._8_4_ = fVar120 * auVar43._8_4_;
      auVar57._12_4_ = fVar121 * auVar43._12_4_;
      auVar43 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar37 + 0x80 + uVar40),auVar54,
                                *(undefined1 (*) [16])(uVar37 + 0x20 + uVar40));
      auVar43 = vsubps_avx512vl(auVar43,auVar133._0_16_);
      auVar67._0_4_ = fVar122 * auVar43._0_4_;
      auVar67._4_4_ = fVar124 * auVar43._4_4_;
      auVar67._8_4_ = fVar125 * auVar43._8_4_;
      auVar67._12_4_ = fVar126 * auVar43._12_4_;
      auVar43 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar37 + 0x80 + uVar38),auVar54,
                                *(undefined1 (*) [16])(uVar37 + 0x20 + uVar38));
      auVar43 = vsubps_avx(auVar43,auVar103._0_16_);
      auVar63._0_4_ = fVar127 * auVar43._0_4_;
      auVar63._4_4_ = fVar128 * auVar43._4_4_;
      auVar63._8_4_ = fVar129 * auVar43._8_4_;
      auVar63._12_4_ = fVar130 * auVar43._12_4_;
      auVar43 = vminps_avx(auVar67,auVar63);
      auVar51 = vminps_avx(auVar96._0_16_,auVar57);
      auVar43 = vminps_avx(auVar51,auVar43);
      uVar17 = vcmpps_avx512vl(auVar42,auVar43,2);
      uVar29 = (uint)uVar17;
      if (((uint)uVar39 & 7) == 6) {
        uVar19 = vcmpps_avx512vl(auVar54,*(undefined1 (*) [16])(uVar37 + 0xf0),1);
        uVar18 = vcmpps_avx512vl(auVar54,*(undefined1 (*) [16])(uVar37 + 0xe0),0xd);
        uVar29 = (uint)(byte)((byte)uVar19 & (byte)uVar18 & (byte)uVar17);
      }
      local_1180._0_16_ = auVar42;
      if ((byte)uVar29 == 0) break;
      lVar20 = 0;
      for (uVar39 = (ulong)(byte)uVar29; (uVar39 & 1) == 0;
          uVar39 = uVar39 >> 1 | 0x8000000000000000) {
        lVar20 = lVar20 + 1;
      }
      uVar39 = *(ulong *)(uVar37 + lVar20 * 8);
      uVar29 = (uVar29 & 0xff) - 1 & uVar29 & 0xff;
      uVar41 = (ulong)uVar29;
      if (uVar29 != 0) {
        uVar30 = *(uint *)(local_1180 + lVar20 * 4);
        lVar20 = 0;
        for (; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x8000000000000000) {
          lVar20 = lVar20 + 1;
        }
        uVar29 = uVar29 - 1 & uVar29;
        uVar32 = (ulong)uVar29;
        uVar41 = *(ulong *)(uVar37 + lVar20 * 8);
        uVar3 = *(uint *)(local_1180 + lVar20 * 4);
        if (uVar29 == 0) {
          if (uVar30 < uVar3) {
            *puVar26 = uVar41;
            *(uint *)(puVar26 + 1) = uVar3;
            puVar26 = puVar26 + 2;
          }
          else {
            *puVar26 = uVar39;
            *(uint *)(puVar26 + 1) = uVar30;
            puVar26 = puVar26 + 2;
            uVar39 = uVar41;
          }
        }
        else {
          auVar42._8_8_ = 0;
          auVar42._0_8_ = uVar39;
          auVar42 = vpunpcklqdq_avx(auVar42,ZEXT416(uVar30));
          auVar68._8_8_ = 0;
          auVar68._0_8_ = uVar41;
          auVar43 = vpunpcklqdq_avx(auVar68,ZEXT416(uVar3));
          lVar20 = 0;
          for (; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
            lVar20 = lVar20 + 1;
          }
          uVar29 = uVar29 - 1 & uVar29;
          uVar39 = (ulong)uVar29;
          auVar65._8_8_ = 0;
          auVar65._0_8_ = *(ulong *)(uVar37 + lVar20 * 8);
          auVar60 = vpunpcklqdq_avx(auVar65,ZEXT416(*(uint *)(local_1180 + lVar20 * 4)));
          auVar51 = vpshufd_avx(auVar42,0xaa);
          auVar54 = vpshufd_avx(auVar43,0xaa);
          auVar57 = vpshufd_avx(auVar60,0xaa);
          if (uVar29 == 0) {
            uVar39 = vpcmpgtd_avx512vl(auVar54,auVar51);
            uVar39 = uVar39 & 0xf;
            auVar54 = vpblendmd_avx512vl(auVar43,auVar42);
            bVar15 = (bool)((byte)uVar39 & 1);
            auVar58._0_4_ = (uint)bVar15 * auVar54._0_4_ | (uint)!bVar15 * auVar51._0_4_;
            bVar15 = (bool)((byte)(uVar39 >> 1) & 1);
            auVar58._4_4_ = (uint)bVar15 * auVar54._4_4_ | (uint)!bVar15 * auVar51._4_4_;
            bVar15 = (bool)((byte)(uVar39 >> 2) & 1);
            auVar58._8_4_ = (uint)bVar15 * auVar54._8_4_ | (uint)!bVar15 * auVar51._8_4_;
            bVar15 = SUB81(uVar39 >> 3,0);
            auVar58._12_4_ = (uint)bVar15 * auVar54._12_4_ | (uint)!bVar15 * auVar51._12_4_;
            auVar43 = vmovdqa32_avx512vl(auVar43);
            bVar15 = (bool)((byte)uVar39 & 1);
            auVar62._0_4_ = (uint)bVar15 * auVar43._0_4_ | (uint)!bVar15 * auVar42._0_4_;
            bVar15 = (bool)((byte)(uVar39 >> 1) & 1);
            auVar62._4_4_ = (uint)bVar15 * auVar43._4_4_ | (uint)!bVar15 * auVar42._4_4_;
            bVar15 = (bool)((byte)(uVar39 >> 2) & 1);
            auVar62._8_4_ = (uint)bVar15 * auVar43._8_4_ | (uint)!bVar15 * auVar42._8_4_;
            bVar15 = SUB81(uVar39 >> 3,0);
            auVar62._12_4_ = (uint)bVar15 * auVar43._12_4_ | (uint)!bVar15 * auVar42._12_4_;
            auVar42 = vpshufd_avx(auVar58,0xaa);
            uVar37 = vpcmpgtd_avx512vl(auVar57,auVar42);
            uVar37 = uVar37 & 0xf;
            auVar43 = vpblendmd_avx512vl(auVar60,auVar58);
            bVar15 = (bool)((byte)uVar37 & 1);
            bVar11 = (bool)((byte)(uVar37 >> 1) & 1);
            uVar39 = CONCAT44((uint)bVar11 * auVar43._4_4_ | (uint)!bVar11 * auVar42._4_4_,
                              (uint)bVar15 * auVar43._0_4_ | (uint)!bVar15 * auVar42._0_4_);
            auVar42 = vmovdqa32_avx512vl(auVar60);
            bVar15 = (bool)((byte)uVar37 & 1);
            auVar48._0_4_ = (uint)bVar15 * auVar42._0_4_ | !bVar15 * auVar58._0_4_;
            bVar15 = (bool)((byte)(uVar37 >> 1) & 1);
            auVar48._4_4_ = (uint)bVar15 * auVar42._4_4_ | !bVar15 * auVar58._4_4_;
            bVar15 = (bool)((byte)(uVar37 >> 2) & 1);
            auVar48._8_4_ = (uint)bVar15 * auVar42._8_4_ | !bVar15 * auVar58._8_4_;
            bVar15 = SUB81(uVar37 >> 3,0);
            auVar48._12_4_ = (uint)bVar15 * auVar42._12_4_ | !bVar15 * auVar58._12_4_;
            auVar42 = vpshufd_avx(auVar48,0xaa);
            auVar43 = vpshufd_avx(auVar62,0xaa);
            uVar37 = vpcmpgtd_avx512vl(auVar42,auVar43);
            uVar37 = uVar37 & 0xf;
            auVar43 = vpblendmd_avx512vl(auVar48,auVar62);
            bVar15 = (bool)((byte)uVar37 & 1);
            auVar50._0_4_ = (uint)bVar15 * auVar43._0_4_ | (uint)!bVar15 * auVar42._0_4_;
            bVar15 = (bool)((byte)(uVar37 >> 1) & 1);
            auVar50._4_4_ = (uint)bVar15 * auVar43._4_4_ | (uint)!bVar15 * auVar42._4_4_;
            bVar15 = (bool)((byte)(uVar37 >> 2) & 1);
            auVar50._8_4_ = (uint)bVar15 * auVar43._8_4_ | (uint)!bVar15 * auVar42._8_4_;
            bVar15 = SUB81(uVar37 >> 3,0);
            auVar50._12_4_ = (uint)bVar15 * auVar43._12_4_ | (uint)!bVar15 * auVar42._12_4_;
            auVar42 = vmovdqa32_avx512vl(auVar48);
            bVar15 = (bool)((byte)uVar37 & 1);
            bVar11 = (bool)((byte)(uVar37 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar37 >> 2) & 1);
            bVar12 = SUB81(uVar37 >> 3,0);
            *(uint *)puVar26 = (uint)bVar15 * auVar42._0_4_ | !bVar15 * auVar62._0_4_;
            *(uint *)((long)puVar26 + 4) = (uint)bVar11 * auVar42._4_4_ | !bVar11 * auVar62._4_4_;
            *(uint *)(puVar26 + 1) = (uint)bVar14 * auVar42._8_4_ | !bVar14 * auVar62._8_4_;
            *(uint *)((long)puVar26 + 0xc) =
                 (uint)bVar12 * auVar42._12_4_ | !bVar12 * auVar62._12_4_;
            *(undefined1 (*) [16])(puVar26 + 2) = auVar50;
            puVar26 = puVar26 + 4;
          }
          else {
            lVar20 = 0;
            for (; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
              lVar20 = lVar20 + 1;
            }
            uVar29 = *(uint *)(local_1180 + lVar20 * 4);
            auVar55._8_8_ = 0;
            auVar55._0_8_ = *(ulong *)(uVar37 + lVar20 * 8);
            auVar67 = vpunpcklqdq_avx(auVar55,ZEXT416(uVar29));
            uVar39 = vpcmpgtd_avx512vl(auVar54,auVar51);
            uVar39 = uVar39 & 0xf;
            auVar54 = vpblendmd_avx512vl(auVar43,auVar42);
            bVar15 = (bool)((byte)uVar39 & 1);
            auVar53._0_4_ = (uint)bVar15 * auVar54._0_4_ | (uint)!bVar15 * auVar51._0_4_;
            bVar15 = (bool)((byte)(uVar39 >> 1) & 1);
            auVar53._4_4_ = (uint)bVar15 * auVar54._4_4_ | (uint)!bVar15 * auVar51._4_4_;
            bVar15 = (bool)((byte)(uVar39 >> 2) & 1);
            auVar53._8_4_ = (uint)bVar15 * auVar54._8_4_ | (uint)!bVar15 * auVar51._8_4_;
            bVar15 = SUB81(uVar39 >> 3,0);
            auVar53._12_4_ = (uint)bVar15 * auVar54._12_4_ | (uint)!bVar15 * auVar51._12_4_;
            auVar43 = vmovdqa32_avx512vl(auVar43);
            bVar15 = (bool)((byte)uVar39 & 1);
            auVar56._0_4_ = (uint)bVar15 * auVar43._0_4_ | (uint)!bVar15 * auVar42._0_4_;
            bVar15 = (bool)((byte)(uVar39 >> 1) & 1);
            auVar56._4_4_ = (uint)bVar15 * auVar43._4_4_ | (uint)!bVar15 * auVar42._4_4_;
            bVar15 = (bool)((byte)(uVar39 >> 2) & 1);
            auVar56._8_4_ = (uint)bVar15 * auVar43._8_4_ | (uint)!bVar15 * auVar42._8_4_;
            bVar15 = SUB81(uVar39 >> 3,0);
            auVar56._12_4_ = (uint)bVar15 * auVar43._12_4_ | (uint)!bVar15 * auVar42._12_4_;
            auVar52._4_4_ = uVar29;
            auVar52._0_4_ = uVar29;
            auVar52._8_4_ = uVar29;
            auVar52._12_4_ = uVar29;
            uVar39 = vpcmpgtd_avx512vl(auVar52,auVar57);
            uVar39 = uVar39 & 0xf;
            auVar42 = vpblendmd_avx512vl(auVar67,auVar60);
            bVar15 = (bool)((byte)uVar39 & 1);
            auVar59._0_4_ = (uint)bVar15 * auVar42._0_4_ | !bVar15 * uVar29;
            bVar15 = (bool)((byte)(uVar39 >> 1) & 1);
            auVar59._4_4_ = (uint)bVar15 * auVar42._4_4_ | !bVar15 * uVar29;
            bVar15 = (bool)((byte)(uVar39 >> 2) & 1);
            auVar59._8_4_ = (uint)bVar15 * auVar42._8_4_ | !bVar15 * uVar29;
            bVar15 = SUB81(uVar39 >> 3,0);
            auVar59._12_4_ = (uint)bVar15 * auVar42._12_4_ | !bVar15 * uVar29;
            auVar42 = vmovdqa32_avx512vl(auVar67);
            bVar15 = (bool)((byte)uVar39 & 1);
            auVar61._0_4_ = (uint)bVar15 * auVar42._0_4_ | (uint)!bVar15 * auVar60._0_4_;
            bVar15 = (bool)((byte)(uVar39 >> 1) & 1);
            auVar61._4_4_ = (uint)bVar15 * auVar42._4_4_ | (uint)!bVar15 * auVar60._4_4_;
            bVar15 = (bool)((byte)(uVar39 >> 2) & 1);
            auVar61._8_4_ = (uint)bVar15 * auVar42._8_4_ | (uint)!bVar15 * auVar60._8_4_;
            bVar15 = SUB81(uVar39 >> 3,0);
            auVar61._12_4_ = (uint)bVar15 * auVar42._12_4_ | (uint)!bVar15 * auVar60._12_4_;
            auVar42 = vpshufd_avx(auVar61,0xaa);
            auVar43 = vpshufd_avx(auVar56,0xaa);
            uVar39 = vpcmpgtd_avx512vl(auVar42,auVar43);
            uVar39 = uVar39 & 0xf;
            auVar43 = vpblendmd_avx512vl(auVar61,auVar56);
            bVar15 = (bool)((byte)uVar39 & 1);
            auVar44._0_4_ = (uint)bVar15 * auVar43._0_4_ | (uint)!bVar15 * auVar42._0_4_;
            bVar15 = (bool)((byte)(uVar39 >> 1) & 1);
            auVar44._4_4_ = (uint)bVar15 * auVar43._4_4_ | (uint)!bVar15 * auVar42._4_4_;
            bVar15 = (bool)((byte)(uVar39 >> 2) & 1);
            auVar44._8_4_ = (uint)bVar15 * auVar43._8_4_ | (uint)!bVar15 * auVar42._8_4_;
            bVar15 = SUB81(uVar39 >> 3,0);
            auVar44._12_4_ = (uint)bVar15 * auVar43._12_4_ | (uint)!bVar15 * auVar42._12_4_;
            auVar51 = vmovdqa32_avx512vl(auVar61);
            bVar15 = (bool)((byte)uVar39 & 1);
            bVar14 = (bool)((byte)(uVar39 >> 1) & 1);
            bVar10 = (bool)((byte)(uVar39 >> 2) & 1);
            bVar13 = SUB81(uVar39 >> 3,0);
            auVar42 = vpshufd_avx(auVar59,0xaa);
            auVar43 = vpshufd_avx(auVar53,0xaa);
            uVar37 = vpcmpgtd_avx512vl(auVar42,auVar43);
            uVar37 = uVar37 & 0xf;
            auVar43 = vpblendmd_avx512vl(auVar59,auVar53);
            bVar11 = (bool)((byte)uVar37 & 1);
            bVar12 = (bool)((byte)(uVar37 >> 1) & 1);
            uVar39 = CONCAT44((uint)bVar12 * auVar43._4_4_ | (uint)!bVar12 * auVar42._4_4_,
                              (uint)bVar11 * auVar43._0_4_ | (uint)!bVar11 * auVar42._0_4_);
            auVar42 = vmovdqa32_avx512vl(auVar59);
            bVar11 = (bool)((byte)uVar37 & 1);
            auVar64._0_4_ = (uint)bVar11 * auVar42._0_4_ | !bVar11 * auVar53._0_4_;
            bVar11 = (bool)((byte)(uVar37 >> 1) & 1);
            auVar64._4_4_ = (uint)bVar11 * auVar42._4_4_ | !bVar11 * auVar53._4_4_;
            bVar11 = (bool)((byte)(uVar37 >> 2) & 1);
            auVar64._8_4_ = (uint)bVar11 * auVar42._8_4_ | !bVar11 * auVar53._8_4_;
            bVar11 = SUB81(uVar37 >> 3,0);
            auVar64._12_4_ = (uint)bVar11 * auVar42._12_4_ | !bVar11 * auVar53._12_4_;
            auVar42 = vpshufd_avx(auVar64,0xaa);
            auVar43 = vpshufd_avx(auVar44,0xaa);
            uVar37 = vpcmpgtd_avx512vl(auVar43,auVar42);
            uVar37 = uVar37 & 0xf;
            auVar43 = vpblendmd_avx512vl(auVar44,auVar64);
            bVar11 = (bool)((byte)uVar37 & 1);
            auVar45._0_4_ = (uint)bVar11 * auVar43._0_4_ | (uint)!bVar11 * auVar42._0_4_;
            bVar11 = (bool)((byte)(uVar37 >> 1) & 1);
            auVar45._4_4_ = (uint)bVar11 * auVar43._4_4_ | (uint)!bVar11 * auVar42._4_4_;
            bVar11 = (bool)((byte)(uVar37 >> 2) & 1);
            auVar45._8_4_ = (uint)bVar11 * auVar43._8_4_ | (uint)!bVar11 * auVar42._8_4_;
            bVar11 = SUB81(uVar37 >> 3,0);
            auVar45._12_4_ = (uint)bVar11 * auVar43._12_4_ | (uint)!bVar11 * auVar42._12_4_;
            auVar42 = vmovdqa32_avx512vl(auVar44);
            bVar11 = (bool)((byte)uVar37 & 1);
            auVar66._0_4_ = (uint)bVar11 * auVar42._0_4_ | !bVar11 * auVar64._0_4_;
            bVar11 = (bool)((byte)(uVar37 >> 1) & 1);
            auVar66._4_4_ = (uint)bVar11 * auVar42._4_4_ | !bVar11 * auVar64._4_4_;
            bVar11 = (bool)((byte)(uVar37 >> 2) & 1);
            auVar66._8_4_ = (uint)bVar11 * auVar42._8_4_ | !bVar11 * auVar64._8_4_;
            bVar11 = SUB81(uVar37 >> 3,0);
            auVar66._12_4_ = (uint)bVar11 * auVar42._12_4_ | !bVar11 * auVar64._12_4_;
            *(uint *)puVar26 = (uint)bVar15 * auVar51._0_4_ | !bVar15 * auVar56._0_4_;
            *(uint *)((long)puVar26 + 4) = (uint)bVar14 * auVar51._4_4_ | !bVar14 * auVar56._4_4_;
            *(uint *)(puVar26 + 1) = (uint)bVar10 * auVar51._8_4_ | !bVar10 * auVar56._8_4_;
            *(uint *)((long)puVar26 + 0xc) =
                 (uint)bVar13 * auVar51._12_4_ | !bVar13 * auVar56._12_4_;
            *(undefined1 (*) [16])(puVar26 + 2) = auVar66;
            *(undefined1 (*) [16])(puVar26 + 4) = auVar45;
            puVar26 = puVar26 + 6;
          }
        }
      }
    }
    if (puVar26 == &local_fa0) {
      return;
    }
  }
  goto LAB_006e508f;
LAB_006e4365:
  do {
    lVar35 = local_1388 * 0x60;
    pSVar4 = context->scene;
    pRVar5 = (pSVar4->geometries).items;
    pGVar6 = pRVar5[*(uint *)(uVar39 + 0x40 + lVar35)].ptr;
    fVar117 = (pGVar6->time_range).lower;
    fVar117 = pGVar6->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0x70) - fVar117) / ((pGVar6->time_range).upper - fVar117));
    auVar42 = vroundss_avx(ZEXT416((uint)fVar117),ZEXT416((uint)fVar117),9);
    auVar42 = vminss_avx(auVar42,ZEXT416((uint)(pGVar6->fnumTimeSegments + -1.0)));
    auVar16 = vmaxss_avx(ZEXT816(0),auVar42);
    iVar33 = (int)auVar16._0_4_;
    lVar31 = (long)iVar33 * 0x38;
    lVar20 = *(long *)(*(long *)&pGVar6[2].numPrimitives + lVar31);
    auVar42 = *(undefined1 (*) [16])(lVar20 + (ulong)*(uint *)(uVar39 + lVar35) * 4);
    uVar41 = (ulong)*(uint *)(uVar39 + 0x10 + lVar35);
    auVar43 = *(undefined1 (*) [16])(lVar20 + uVar41 * 4);
    uVar32 = (ulong)*(uint *)(uVar39 + 0x20 + lVar35);
    auVar51 = *(undefined1 (*) [16])(lVar20 + uVar32 * 4);
    uVar34 = (ulong)*(uint *)(uVar39 + 0x30 + lVar35);
    auVar54 = *(undefined1 (*) [16])(lVar20 + uVar34 * 4);
    uVar37 = (ulong)*(uint *)(uVar39 + 4 + lVar35);
    lVar27 = (long)(iVar33 + 1) * 0x38;
    lVar20 = *(long *)(*(long *)&pGVar6[2].numPrimitives + lVar27);
    auVar57 = *(undefined1 (*) [16])(lVar20 + (ulong)*(uint *)(uVar39 + lVar35) * 4);
    auVar60 = *(undefined1 (*) [16])(lVar20 + uVar41 * 4);
    lVar7 = *(long *)&pRVar5[*(uint *)(uVar39 + 0x44 + lVar35)].ptr[2].numPrimitives;
    lVar8 = *(long *)(lVar7 + lVar31);
    auVar67 = *(undefined1 (*) [16])(lVar8 + uVar37 * 4);
    auVar63 = *(undefined1 (*) [16])(lVar20 + uVar32 * 4);
    uVar32 = (ulong)*(uint *)(uVar39 + 0x14 + lVar35);
    auVar68 = *(undefined1 (*) [16])(lVar8 + uVar32 * 4);
    auVar65 = *(undefined1 (*) [16])(lVar20 + uVar34 * 4);
    uVar41 = (ulong)*(uint *)(uVar39 + 0x24 + lVar35);
    auVar53 = *(undefined1 (*) [16])(lVar8 + uVar41 * 4);
    uVar34 = (ulong)*(uint *)(uVar39 + 0x34 + lVar35);
    auVar56 = *(undefined1 (*) [16])(lVar8 + uVar34 * 4);
    lVar20 = *(long *)&pRVar5[*(uint *)(uVar39 + 0x48 + lVar35)].ptr[2].numPrimitives;
    lVar7 = *(long *)(lVar7 + lVar27);
    auVar59 = *(undefined1 (*) [16])(lVar7 + uVar37 * 4);
    lVar8 = *(long *)(lVar20 + lVar31);
    auVar61 = *(undefined1 (*) [16])(lVar7 + uVar32 * 4);
    uVar32 = (ulong)*(uint *)(uVar39 + 8 + lVar35);
    auVar44 = *(undefined1 (*) [16])(lVar8 + uVar32 * 4);
    auVar64 = *(undefined1 (*) [16])(lVar7 + uVar41 * 4);
    uVar41 = (ulong)*(uint *)(uVar39 + 0x18 + lVar35);
    auVar45 = *(undefined1 (*) [16])(lVar8 + uVar41 * 4);
    auVar66 = *(undefined1 (*) [16])(lVar7 + uVar34 * 4);
    uVar37 = (ulong)*(uint *)(uVar39 + 0x28 + lVar35);
    auVar52 = *(undefined1 (*) [16])(lVar8 + uVar37 * 4);
    uVar34 = (ulong)*(uint *)(uVar39 + 0x38 + lVar35);
    auVar55 = *(undefined1 (*) [16])(lVar8 + uVar34 * 4);
    lVar20 = *(long *)(lVar20 + lVar27);
    auVar58 = *(undefined1 (*) [16])(lVar20 + uVar32 * 4);
    lVar7 = *(long *)&pRVar5[*(uint *)(uVar39 + 0x4c + lVar35)].ptr[2].numPrimitives;
    lVar8 = *(long *)(lVar7 + lVar31);
    auVar62 = *(undefined1 (*) [16])(lVar20 + uVar41 * 4);
    uVar32 = (ulong)*(uint *)(uVar39 + 0xc + lVar35);
    auVar48 = *(undefined1 (*) [16])(lVar8 + uVar32 * 4);
    auVar118 = *(undefined1 (*) [16])(lVar20 + uVar37 * 4);
    uVar41 = (ulong)*(uint *)(uVar39 + 0x1c + lVar35);
    auVar50 = *(undefined1 (*) [16])(lVar8 + uVar41 * 4);
    auVar46 = vunpcklps_avx512vl(auVar42,auVar44);
    auVar44 = vunpckhps_avx(auVar42,auVar44);
    auVar47 = vunpcklps_avx512vl(auVar67,auVar48);
    auVar67 = vunpckhps_avx(auVar67,auVar48);
    auVar42 = *(undefined1 (*) [16])(lVar20 + uVar34 * 4);
    uVar37 = (ulong)*(uint *)(uVar39 + 0x2c + lVar35);
    auVar44 = vunpcklps_avx(auVar44,auVar67);
    auVar48 = vunpcklps_avx512vl(auVar46,auVar47);
    auVar46 = vunpckhps_avx512vl(auVar46,auVar47);
    auVar47 = vunpcklps_avx512vl(auVar43,auVar45);
    auVar49 = vunpckhps_avx512vl(auVar43,auVar45);
    auVar45 = vunpcklps_avx(auVar68,auVar50);
    auVar67 = vunpckhps_avx(auVar68,auVar50);
    auVar43 = *(undefined1 (*) [16])(lVar8 + uVar37 * 4);
    uVar34 = (ulong)*(uint *)(uVar39 + 0x3c + lVar35);
    auVar68 = vunpcklps_avx(auVar49,auVar67);
    auVar50 = vunpcklps_avx512vl(auVar47,auVar45);
    auVar67 = vunpckhps_avx(auVar47,auVar45);
    auVar47 = vunpcklps_avx512vl(auVar51,auVar52);
    auVar51 = vunpckhps_avx512vl(auVar51,auVar52);
    auVar52 = vunpcklps_avx512vl(auVar53,auVar43);
    auVar53 = vunpckhps_avx512vl(auVar53,auVar43);
    auVar43 = *(undefined1 (*) [16])(lVar8 + uVar34 * 4);
    lVar20 = *(long *)(lVar7 + lVar27);
    auVar53 = vunpcklps_avx(auVar51,auVar53);
    auVar45 = vunpcklps_avx(auVar47,auVar52);
    auVar51 = vunpckhps_avx(auVar47,auVar52);
    auVar52 = vunpcklps_avx512vl(auVar54,auVar55);
    auVar54 = vunpckhps_avx512vl(auVar54,auVar55);
    auVar55 = vunpcklps_avx512vl(auVar56,auVar43);
    auVar56 = vunpckhps_avx512vl(auVar56,auVar43);
    auVar43 = *(undefined1 (*) [16])(lVar20 + uVar32 * 4);
    auVar54 = vunpcklps_avx(auVar54,auVar56);
    auVar56 = vunpcklps_avx512vl(auVar52,auVar55);
    auVar52 = vunpckhps_avx512vl(auVar52,auVar55);
    auVar55 = vunpcklps_avx512vl(auVar57,auVar58);
    auVar57 = vunpckhps_avx512vl(auVar57,auVar58);
    auVar58 = vunpcklps_avx512vl(auVar59,auVar43);
    auVar59 = vunpckhps_avx512vl(auVar59,auVar43);
    auVar43 = *(undefined1 (*) [16])(lVar20 + uVar41 * 4);
    auVar59 = vunpcklps_avx512vl(auVar57,auVar59);
    auVar47 = vunpcklps_avx512vl(auVar55,auVar58);
    auVar55 = vunpckhps_avx512vl(auVar55,auVar58);
    auVar57 = vunpcklps_avx512vl(auVar60,auVar62);
    auVar60 = vunpckhps_avx512vl(auVar60,auVar62);
    auVar58 = vunpcklps_avx512vl(auVar61,auVar43);
    auVar61 = vunpckhps_avx512vl(auVar61,auVar43);
    auVar43 = *(undefined1 (*) [16])(lVar20 + uVar37 * 4);
    auVar60 = vunpcklps_avx512vl(auVar60,auVar61);
    auVar61 = vunpcklps_avx512vl(auVar57,auVar58);
    auVar58 = vunpckhps_avx512vl(auVar57,auVar58);
    auVar62 = vunpcklps_avx512vl(auVar63,auVar118);
    auVar57 = vunpckhps_avx512vl(auVar63,auVar118);
    auVar63 = vunpcklps_avx512vl(auVar64,auVar43);
    auVar64 = vunpckhps_avx512vl(auVar64,auVar43);
    auVar43 = *(undefined1 (*) [16])(lVar20 + uVar34 * 4);
    auVar57 = vunpcklps_avx(auVar57,auVar64);
    auVar64 = vunpcklps_avx512vl(auVar62,auVar63);
    auVar63 = vunpckhps_avx512vl(auVar62,auVar63);
    auVar62 = vunpcklps_avx512vl(auVar65,auVar42);
    auVar42 = vunpckhps_avx512vl(auVar65,auVar42);
    auVar65 = vunpcklps_avx512vl(auVar66,auVar43);
    auVar43 = vunpckhps_avx512vl(auVar66,auVar43);
    auVar42 = vunpcklps_avx(auVar42,auVar43);
    auVar66 = vunpcklps_avx512vl(auVar62,auVar65);
    auVar65 = vunpckhps_avx512vl(auVar62,auVar65);
    auVar43 = ZEXT416((uint)(fVar117 - auVar16._0_4_));
    auVar62 = vbroadcastss_avx512vl(auVar43);
    auVar43 = vsubss_avx512f(ZEXT416(0x3f800000),auVar43);
    auVar118._0_4_ = auVar43._0_4_;
    auVar118._4_4_ = auVar118._0_4_;
    auVar118._8_4_ = auVar118._0_4_;
    auVar118._12_4_ = auVar118._0_4_;
    auVar43 = vmulps_avx512vl(auVar62,auVar47);
    auVar48 = vfmadd231ps_avx512vl(auVar43,auVar118,auVar48);
    auVar43 = vmulps_avx512vl(auVar62,auVar55);
    auVar55 = vfmadd231ps_avx512vl(auVar43,auVar118,auVar46);
    auVar43 = vmulps_avx512vl(auVar62,auVar59);
    auVar43 = vfmadd231ps_fma(auVar43,auVar118,auVar44);
    auVar59 = vmulps_avx512vl(auVar62,auVar61);
    auVar59 = vfmadd231ps_avx512vl(auVar59,auVar118,auVar50);
    auVar69 = vbroadcasti32x4_avx512vl(*(undefined1 (*) [16])(uVar39 + 0x10 + lVar35));
    local_fc0 = vmovdqa64_avx512vl(auVar69);
    auVar69 = vbroadcasti32x4_avx512vl(*(undefined1 (*) [16])(uVar39 + 0x14 + lVar35));
    auVar61 = vmulps_avx512vl(auVar62,auVar58);
    auVar60 = vmulps_avx512vl(auVar62,auVar60);
    auVar61 = vfmadd231ps_avx512vl(auVar61,auVar118,auVar67);
    auVar60 = vfmadd231ps_fma(auVar60,auVar118,auVar68);
    auVar67 = vmulps_avx512vl(auVar62,auVar64);
    auVar63 = vmulps_avx512vl(auVar62,auVar63);
    auVar68 = vmulps_avx512vl(auVar62,auVar57);
    auVar57 = vfmadd231ps_fma(auVar67,auVar118,auVar45);
    auVar51 = vfmadd231ps_fma(auVar63,auVar118,auVar51);
    auVar67 = vfmadd231ps_fma(auVar68,auVar118,auVar53);
    auVar63 = vmulps_avx512vl(auVar62,auVar66);
    auVar68 = vmulps_avx512vl(auVar62,auVar65);
    auVar65 = vmulps_avx512vl(auVar62,auVar42);
    auVar42 = vfmadd231ps_fma(auVar63,auVar118,auVar56);
    auVar63 = vfmadd231ps_fma(auVar68,auVar118,auVar52);
    auVar54 = vfmadd231ps_fma(auVar65,auVar118,auVar54);
    local_1240 = vmovdqa64_avx512vl(auVar69);
    auVar69 = vinsertf32x4_avx512vl(ZEXT1632(auVar48),auVar57,1);
    auVar70 = vinsertf32x4_avx512vl(ZEXT1632(auVar55),auVar51,1);
    auVar74._16_16_ = auVar67;
    auVar74._0_16_ = auVar43;
    auVar77._16_16_ = auVar59;
    auVar77._0_16_ = auVar59;
    auVar71 = vinsertf32x4_avx512vl(ZEXT1632(auVar61),auVar61,1);
    auVar79._16_16_ = auVar60;
    auVar79._0_16_ = auVar60;
    auVar78._16_16_ = auVar42;
    auVar78._0_16_ = auVar42;
    auVar80._16_16_ = auVar63;
    auVar80._0_16_ = auVar63;
    uVar101 = *(undefined4 *)(ray + k * 4);
    auVar81._4_4_ = uVar101;
    auVar81._0_4_ = uVar101;
    auVar81._8_4_ = uVar101;
    auVar81._12_4_ = uVar101;
    auVar81._16_4_ = uVar101;
    auVar81._20_4_ = uVar101;
    auVar81._24_4_ = uVar101;
    auVar81._28_4_ = uVar101;
    uVar101 = *(undefined4 *)(ray + k * 4 + 0x10);
    auVar82._4_4_ = uVar101;
    auVar82._0_4_ = uVar101;
    auVar82._8_4_ = uVar101;
    auVar82._12_4_ = uVar101;
    auVar82._16_4_ = uVar101;
    auVar82._20_4_ = uVar101;
    auVar82._24_4_ = uVar101;
    auVar82._28_4_ = uVar101;
    auVar72 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
    uVar101 = *(undefined4 *)(ray + k * 4 + 0x40);
    auVar97._4_4_ = uVar101;
    auVar97._0_4_ = uVar101;
    auVar97._8_4_ = uVar101;
    auVar97._12_4_ = uVar101;
    auVar97._16_4_ = uVar101;
    auVar97._20_4_ = uVar101;
    auVar97._24_4_ = uVar101;
    auVar97._28_4_ = uVar101;
    auVar73 = vinsertf32x4_avx512vl(ZEXT1632(auVar54),auVar54,1);
    uVar101 = *(undefined4 *)(ray + k * 4 + 0x50);
    auVar100._4_4_ = uVar101;
    auVar100._0_4_ = uVar101;
    auVar100._8_4_ = uVar101;
    auVar100._12_4_ = uVar101;
    auVar100._16_4_ = uVar101;
    auVar100._20_4_ = uVar101;
    auVar100._24_4_ = uVar101;
    auVar100._28_4_ = uVar101;
    fVar117 = *(float *)(ray + k * 4 + 0x60);
    auVar105._4_4_ = fVar117;
    auVar105._0_4_ = fVar117;
    auVar105._8_4_ = fVar117;
    auVar105._12_4_ = fVar117;
    auVar105._16_4_ = fVar117;
    auVar105._20_4_ = fVar117;
    auVar105._24_4_ = fVar117;
    auVar105._28_4_ = fVar117;
    auVar69 = vsubps_avx(auVar69,auVar81);
    auVar70 = vsubps_avx(auVar70,auVar82);
    auVar74 = vsubps_avx512vl(auVar74,auVar72);
    auVar75 = vsubps_avx512vl(auVar77,auVar81);
    auVar76 = vsubps_avx512vl(auVar71,auVar82);
    auVar77 = vsubps_avx512vl(auVar79,auVar72);
    auVar71 = vsubps_avx(auVar78,auVar81);
    auVar78 = vsubps_avx512vl(auVar80,auVar82);
    auVar73 = vsubps_avx512vl(auVar73,auVar72);
    auVar72 = vsubps_avx(auVar71,auVar69);
    auVar79 = vsubps_avx512vl(auVar78,auVar70);
    auVar80 = vsubps_avx512vl(auVar73,auVar74);
    auVar81 = vsubps_avx512vl(auVar69,auVar75);
    auVar82 = vsubps_avx512vl(auVar70,auVar76);
    auVar83 = vsubps_avx512vl(auVar74,auVar77);
    auVar88._0_4_ = auVar71._0_4_ + auVar69._0_4_;
    auVar88._4_4_ = auVar71._4_4_ + auVar69._4_4_;
    auVar88._8_4_ = auVar71._8_4_ + auVar69._8_4_;
    auVar88._12_4_ = auVar71._12_4_ + auVar69._12_4_;
    auVar88._16_4_ = auVar71._16_4_ + auVar69._16_4_;
    auVar88._20_4_ = auVar71._20_4_ + auVar69._20_4_;
    auVar88._24_4_ = auVar71._24_4_ + auVar69._24_4_;
    auVar88._28_4_ = auVar71._28_4_ + auVar69._28_4_;
    auVar84 = vaddps_avx512vl(auVar78,auVar70);
    auVar85 = vaddps_avx512vl(auVar73,auVar74);
    auVar86._4_4_ = auVar80._4_4_ * auVar84._4_4_;
    auVar86._0_4_ = auVar80._0_4_ * auVar84._0_4_;
    auVar86._8_4_ = auVar80._8_4_ * auVar84._8_4_;
    auVar86._12_4_ = auVar80._12_4_ * auVar84._12_4_;
    auVar86._16_4_ = auVar80._16_4_ * auVar84._16_4_;
    auVar86._20_4_ = auVar80._20_4_ * auVar84._20_4_;
    auVar86._24_4_ = auVar80._24_4_ * auVar84._24_4_;
    auVar86._28_4_ = auVar67._12_4_;
    auVar43 = vfmsub231ps_fma(auVar86,auVar79,auVar85);
    auVar87._4_4_ = auVar72._4_4_ * auVar85._4_4_;
    auVar87._0_4_ = auVar72._0_4_ * auVar85._0_4_;
    auVar87._8_4_ = auVar72._8_4_ * auVar85._8_4_;
    auVar87._12_4_ = auVar72._12_4_ * auVar85._12_4_;
    auVar87._16_4_ = auVar72._16_4_ * auVar85._16_4_;
    auVar87._20_4_ = auVar72._20_4_ * auVar85._20_4_;
    auVar87._24_4_ = auVar72._24_4_ * auVar85._24_4_;
    auVar87._28_4_ = auVar85._28_4_;
    auVar42 = vfmsub231ps_fma(auVar87,auVar80,auVar88);
    auVar85._4_4_ = auVar79._4_4_ * auVar88._4_4_;
    auVar85._0_4_ = auVar79._0_4_ * auVar88._0_4_;
    auVar85._8_4_ = auVar79._8_4_ * auVar88._8_4_;
    auVar85._12_4_ = auVar79._12_4_ * auVar88._12_4_;
    auVar85._16_4_ = auVar79._16_4_ * auVar88._16_4_;
    auVar85._20_4_ = auVar79._20_4_ * auVar88._20_4_;
    auVar85._24_4_ = auVar79._24_4_ * auVar88._24_4_;
    auVar85._28_4_ = auVar88._28_4_;
    auVar51 = vfmsub231ps_fma(auVar85,auVar72,auVar84);
    auVar91._0_4_ = fVar117 * auVar51._0_4_;
    auVar91._4_4_ = fVar117 * auVar51._4_4_;
    auVar91._8_4_ = fVar117 * auVar51._8_4_;
    auVar91._12_4_ = fVar117 * auVar51._12_4_;
    auVar91._16_4_ = fVar117 * 0.0;
    auVar91._20_4_ = fVar117 * 0.0;
    auVar91._24_4_ = fVar117 * 0.0;
    auVar91._28_4_ = 0;
    auVar42 = vfmadd231ps_fma(auVar91,auVar100,ZEXT1632(auVar42));
    auVar42 = vfmadd231ps_fma(ZEXT1632(auVar42),auVar97,ZEXT1632(auVar43));
    auVar86 = vaddps_avx512vl(auVar69,auVar75);
    auVar87 = vaddps_avx512vl(auVar70,auVar76);
    auVar85 = vaddps_avx512vl(auVar74,auVar77);
    auVar84 = vmulps_avx512vl(auVar87,auVar83);
    auVar88 = vfmsub231ps_avx512vl(auVar84,auVar82,auVar85);
    auVar84._4_4_ = auVar81._4_4_ * auVar85._4_4_;
    auVar84._0_4_ = auVar81._0_4_ * auVar85._0_4_;
    auVar84._8_4_ = auVar81._8_4_ * auVar85._8_4_;
    auVar84._12_4_ = auVar81._12_4_ * auVar85._12_4_;
    auVar84._16_4_ = auVar81._16_4_ * auVar85._16_4_;
    auVar84._20_4_ = auVar81._20_4_ * auVar85._20_4_;
    auVar84._24_4_ = auVar81._24_4_ * auVar85._24_4_;
    auVar84._28_4_ = auVar85._28_4_;
    auVar85 = vfmsub231ps_avx512vl(auVar84,auVar83,auVar86);
    auVar86 = vmulps_avx512vl(auVar86,auVar82);
    auVar43 = vfmsub231ps_fma(auVar86,auVar81,auVar87);
    auVar86 = vsubps_avx512vl(auVar75,auVar71);
    auVar99._0_4_ = fVar117 * auVar43._0_4_;
    auVar99._4_4_ = fVar117 * auVar43._4_4_;
    auVar99._8_4_ = fVar117 * auVar43._8_4_;
    auVar99._12_4_ = fVar117 * auVar43._12_4_;
    auVar99._16_4_ = fVar117 * 0.0;
    auVar99._20_4_ = fVar117 * 0.0;
    auVar99._24_4_ = fVar117 * 0.0;
    auVar99._28_4_ = 0;
    auVar43 = vfmadd231ps_fma(auVar99,auVar100,auVar85);
    auVar87 = vsubps_avx512vl(auVar76,auVar78);
    local_1160 = vfmadd231ps_avx512vl(ZEXT1632(auVar43),auVar97,auVar88);
    auVar85 = vsubps_avx512vl(auVar77,auVar73);
    auVar71 = vaddps_avx512vl(auVar75,auVar71);
    auVar75 = vaddps_avx512vl(auVar76,auVar78);
    auVar73 = vaddps_avx512vl(auVar77,auVar73);
    auVar84 = vmulps_avx512vl(auVar75,auVar85);
    auVar84 = vfmsub231ps_avx512vl(auVar84,auVar87,auVar73);
    auVar73 = vmulps_avx512vl(auVar73,auVar86);
    auVar73 = vfmsub231ps_avx512vl(auVar73,auVar85,auVar71);
    auVar76._4_4_ = auVar71._4_4_ * auVar87._4_4_;
    auVar76._0_4_ = auVar71._0_4_ * auVar87._0_4_;
    auVar76._8_4_ = auVar71._8_4_ * auVar87._8_4_;
    auVar76._12_4_ = auVar71._12_4_ * auVar87._12_4_;
    auVar76._16_4_ = auVar71._16_4_ * auVar87._16_4_;
    auVar76._20_4_ = auVar71._20_4_ * auVar87._20_4_;
    auVar76._24_4_ = auVar71._24_4_ * auVar87._24_4_;
    auVar76._28_4_ = auVar71._28_4_;
    auVar71 = vfmsub231ps_avx512vl(auVar76,auVar86,auVar75);
    auVar71 = vmulps_avx512vl(auVar71,auVar105);
    auVar71 = vfmadd231ps_avx512vl(auVar71,auVar100,auVar73);
    auVar84 = vfmadd231ps_avx512vl(auVar71,auVar97,auVar84);
    auVar123._0_4_ = auVar42._0_4_ + local_1160._0_4_;
    auVar123._4_4_ = auVar42._4_4_ + local_1160._4_4_;
    auVar123._8_4_ = auVar42._8_4_ + local_1160._8_4_;
    auVar123._12_4_ = auVar42._12_4_ + local_1160._12_4_;
    auVar123._16_4_ = local_1160._16_4_ + 0.0;
    auVar123._20_4_ = local_1160._20_4_ + 0.0;
    auVar123._24_4_ = local_1160._24_4_ + 0.0;
    auVar123._28_4_ = local_1160._28_4_ + 0.0;
    local_1140 = vaddps_avx512vl(auVar84,auVar123);
    auVar71._8_4_ = 0x7fffffff;
    auVar71._0_8_ = 0x7fffffff7fffffff;
    auVar71._12_4_ = 0x7fffffff;
    auVar71._16_4_ = 0x7fffffff;
    auVar71._20_4_ = 0x7fffffff;
    auVar71._24_4_ = 0x7fffffff;
    auVar71._28_4_ = 0x7fffffff;
    vandps_avx512vl(local_1140,auVar71);
    auVar73._8_4_ = 0x34000000;
    auVar73._0_8_ = 0x3400000034000000;
    auVar73._12_4_ = 0x34000000;
    auVar73._16_4_ = 0x34000000;
    auVar73._20_4_ = 0x34000000;
    auVar73._24_4_ = 0x34000000;
    auVar73._28_4_ = 0x34000000;
    auVar71 = vmulps_avx512vl(local_1140,auVar73);
    auVar76 = ZEXT1632(auVar42);
    auVar73 = vminps_avx512vl(auVar76,local_1160);
    auVar73 = vminps_avx512vl(auVar73,auVar84);
    auVar75._8_4_ = 0x80000000;
    auVar75._0_8_ = 0x8000000080000000;
    auVar75._12_4_ = 0x80000000;
    auVar75._16_4_ = 0x80000000;
    auVar75._20_4_ = 0x80000000;
    auVar75._24_4_ = 0x80000000;
    auVar75._28_4_ = 0x80000000;
    auVar75 = vxorps_avx512vl(auVar71,auVar75);
    uVar17 = vcmpps_avx512vl(auVar73,auVar75,5);
    auVar73 = vmaxps_avx512vl(auVar76,local_1160);
    auVar73 = vmaxps_avx512vl(auVar73,auVar84);
    uVar19 = vcmpps_avx512vl(auVar73,auVar71,2);
    bVar25 = (byte)uVar17 | (byte)uVar19;
    if (bVar25 != 0) {
      auVar71 = vmulps_avx512vl(auVar82,auVar80);
      auVar73 = vmulps_avx512vl(auVar72,auVar83);
      auVar75 = vmulps_avx512vl(auVar81,auVar79);
      auVar84 = vmulps_avx512vl(auVar87,auVar83);
      auVar77 = vmulps_avx512vl(auVar81,auVar85);
      auVar78 = vmulps_avx512vl(auVar86,auVar82);
      auVar79 = vfmsub213ps_avx512vl(auVar79,auVar83,auVar71);
      auVar80 = vfmsub213ps_avx512vl(auVar80,auVar81,auVar73);
      auVar72 = vfmsub213ps_avx512vl(auVar72,auVar82,auVar75);
      auVar85 = vfmsub213ps_avx512vl(auVar85,auVar82,auVar84);
      auVar86 = vfmsub213ps_avx512vl(auVar86,auVar83,auVar77);
      auVar87 = vfmsub213ps_avx512vl(auVar87,auVar81,auVar78);
      auVar81 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar71,auVar81);
      vandps_avx512vl(auVar84,auVar81);
      uVar37 = vcmpps_avx512vl(auVar81,auVar81,1);
      vandps_avx512vl(auVar73,auVar81);
      vandps_avx512vl(auVar77,auVar81);
      uVar41 = vcmpps_avx512vl(auVar81,auVar81,1);
      vandps_avx512vl(auVar75,auVar81);
      vandps_avx512vl(auVar78,auVar81);
      uVar32 = vcmpps_avx512vl(auVar81,auVar81,1);
      bVar15 = (bool)((byte)uVar37 & 1);
      local_1120._0_4_ = (float)((uint)bVar15 * auVar79._0_4_ | (uint)!bVar15 * auVar85._0_4_);
      bVar15 = (bool)((byte)(uVar37 >> 1) & 1);
      local_1120._4_4_ = (float)((uint)bVar15 * auVar79._4_4_ | (uint)!bVar15 * auVar85._4_4_);
      bVar15 = (bool)((byte)(uVar37 >> 2) & 1);
      local_1120._8_4_ = (float)((uint)bVar15 * auVar79._8_4_ | (uint)!bVar15 * auVar85._8_4_);
      bVar15 = (bool)((byte)(uVar37 >> 3) & 1);
      local_1120._12_4_ = (float)((uint)bVar15 * auVar79._12_4_ | (uint)!bVar15 * auVar85._12_4_);
      bVar15 = (bool)((byte)(uVar37 >> 4) & 1);
      local_1120._16_4_ = (float)((uint)bVar15 * auVar79._16_4_ | (uint)!bVar15 * auVar85._16_4_);
      bVar15 = (bool)((byte)(uVar37 >> 5) & 1);
      local_1120._20_4_ = (float)((uint)bVar15 * auVar79._20_4_ | (uint)!bVar15 * auVar85._20_4_);
      bVar15 = (bool)((byte)(uVar37 >> 6) & 1);
      local_1120._24_4_ = (float)((uint)bVar15 * auVar79._24_4_ | (uint)!bVar15 * auVar85._24_4_);
      bVar15 = SUB81(uVar37 >> 7,0);
      local_1120._28_4_ = (uint)bVar15 * auVar79._28_4_ | (uint)!bVar15 * auVar85._28_4_;
      bVar15 = (bool)((byte)uVar41 & 1);
      local_1100._0_4_ = (float)((uint)bVar15 * auVar80._0_4_ | (uint)!bVar15 * auVar86._0_4_);
      bVar15 = (bool)((byte)(uVar41 >> 1) & 1);
      local_1100._4_4_ = (float)((uint)bVar15 * auVar80._4_4_ | (uint)!bVar15 * auVar86._4_4_);
      bVar15 = (bool)((byte)(uVar41 >> 2) & 1);
      local_1100._8_4_ = (float)((uint)bVar15 * auVar80._8_4_ | (uint)!bVar15 * auVar86._8_4_);
      bVar15 = (bool)((byte)(uVar41 >> 3) & 1);
      local_1100._12_4_ = (float)((uint)bVar15 * auVar80._12_4_ | (uint)!bVar15 * auVar86._12_4_);
      bVar15 = (bool)((byte)(uVar41 >> 4) & 1);
      local_1100._16_4_ = (float)((uint)bVar15 * auVar80._16_4_ | (uint)!bVar15 * auVar86._16_4_);
      bVar15 = (bool)((byte)(uVar41 >> 5) & 1);
      local_1100._20_4_ = (float)((uint)bVar15 * auVar80._20_4_ | (uint)!bVar15 * auVar86._20_4_);
      bVar15 = (bool)((byte)(uVar41 >> 6) & 1);
      local_1100._24_4_ = (float)((uint)bVar15 * auVar80._24_4_ | (uint)!bVar15 * auVar86._24_4_);
      bVar15 = SUB81(uVar41 >> 7,0);
      local_1100._28_4_ = (uint)bVar15 * auVar80._28_4_ | (uint)!bVar15 * auVar86._28_4_;
      bVar15 = (bool)((byte)uVar32 & 1);
      local_10e0._0_4_ = (float)((uint)bVar15 * auVar72._0_4_ | (uint)!bVar15 * auVar87._0_4_);
      bVar15 = (bool)((byte)(uVar32 >> 1) & 1);
      local_10e0._4_4_ = (float)((uint)bVar15 * auVar72._4_4_ | (uint)!bVar15 * auVar87._4_4_);
      bVar15 = (bool)((byte)(uVar32 >> 2) & 1);
      local_10e0._8_4_ = (float)((uint)bVar15 * auVar72._8_4_ | (uint)!bVar15 * auVar87._8_4_);
      bVar15 = (bool)((byte)(uVar32 >> 3) & 1);
      local_10e0._12_4_ = (float)((uint)bVar15 * auVar72._12_4_ | (uint)!bVar15 * auVar87._12_4_);
      bVar15 = (bool)((byte)(uVar32 >> 4) & 1);
      local_10e0._16_4_ = (float)((uint)bVar15 * auVar72._16_4_ | (uint)!bVar15 * auVar87._16_4_);
      bVar15 = (bool)((byte)(uVar32 >> 5) & 1);
      local_10e0._20_4_ = (float)((uint)bVar15 * auVar72._20_4_ | (uint)!bVar15 * auVar87._20_4_);
      bVar15 = (bool)((byte)(uVar32 >> 6) & 1);
      local_10e0._24_4_ = (float)((uint)bVar15 * auVar72._24_4_ | (uint)!bVar15 * auVar87._24_4_);
      bVar15 = SUB81(uVar32 >> 7,0);
      local_10e0._28_4_ = (uint)bVar15 * auVar72._28_4_ | (uint)!bVar15 * auVar87._28_4_;
      auVar72._4_4_ = fVar117 * local_10e0._4_4_;
      auVar72._0_4_ = fVar117 * local_10e0._0_4_;
      auVar72._8_4_ = fVar117 * local_10e0._8_4_;
      auVar72._12_4_ = fVar117 * local_10e0._12_4_;
      auVar72._16_4_ = fVar117 * local_10e0._16_4_;
      auVar72._20_4_ = fVar117 * local_10e0._20_4_;
      auVar72._24_4_ = fVar117 * local_10e0._24_4_;
      auVar72._28_4_ = fVar117;
      auVar43 = vfmadd213ps_fma(auVar100,local_1100,auVar72);
      auVar43 = vfmadd213ps_fma(auVar97,local_1120,ZEXT1632(auVar43));
      auVar71 = ZEXT1632(CONCAT412(auVar43._12_4_ + auVar43._12_4_,
                                   CONCAT48(auVar43._8_4_ + auVar43._8_4_,
                                            CONCAT44(auVar43._4_4_ + auVar43._4_4_,
                                                     auVar43._0_4_ + auVar43._0_4_))));
      auVar83._0_4_ = auVar74._0_4_ * local_10e0._0_4_;
      auVar83._4_4_ = auVar74._4_4_ * local_10e0._4_4_;
      auVar83._8_4_ = auVar74._8_4_ * local_10e0._8_4_;
      auVar83._12_4_ = auVar74._12_4_ * local_10e0._12_4_;
      auVar83._16_4_ = auVar74._16_4_ * local_10e0._16_4_;
      auVar83._20_4_ = auVar74._20_4_ * local_10e0._20_4_;
      auVar83._24_4_ = auVar74._24_4_ * local_10e0._24_4_;
      auVar83._28_4_ = 0;
      auVar43 = vfmadd213ps_fma(auVar70,local_1100,auVar83);
      auVar51 = vfmadd213ps_fma(auVar69,local_1120,ZEXT1632(auVar43));
      auVar70 = vrcp14ps_avx512vl(auVar71);
      auVar69._8_4_ = 0x3f800000;
      auVar69._0_8_ = 0x3f8000003f800000;
      auVar69._12_4_ = 0x3f800000;
      auVar69._16_4_ = 0x3f800000;
      auVar69._20_4_ = 0x3f800000;
      auVar69._24_4_ = 0x3f800000;
      auVar69._28_4_ = 0x3f800000;
      auVar69 = vfnmadd213ps_avx512vl(auVar70,auVar71,auVar69);
      auVar43 = vfmadd132ps_fma(auVar69,auVar70,auVar70);
      uVar101 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar102._4_4_ = uVar101;
      auVar102._0_4_ = uVar101;
      auVar102._8_4_ = uVar101;
      auVar102._12_4_ = uVar101;
      auVar102._16_4_ = uVar101;
      auVar102._20_4_ = uVar101;
      auVar102._24_4_ = uVar101;
      auVar102._28_4_ = uVar101;
      auVar103 = ZEXT3264(auVar102);
      local_1060 = ZEXT1632(CONCAT412(auVar43._12_4_ * (auVar51._12_4_ + auVar51._12_4_),
                                      CONCAT48(auVar43._8_4_ * (auVar51._8_4_ + auVar51._8_4_),
                                               CONCAT44(auVar43._4_4_ *
                                                        (auVar51._4_4_ + auVar51._4_4_),
                                                        auVar43._0_4_ *
                                                        (auVar51._0_4_ + auVar51._0_4_)))));
      auVar96 = ZEXT3264(local_1060);
      uVar17 = vcmpps_avx512vl(local_1060,auVar102,2);
      uVar101 = *(undefined4 *)(ray + k * 4 + 0x30);
      auVar70._4_4_ = uVar101;
      auVar70._0_4_ = uVar101;
      auVar70._8_4_ = uVar101;
      auVar70._12_4_ = uVar101;
      auVar70._16_4_ = uVar101;
      auVar70._20_4_ = uVar101;
      auVar70._24_4_ = uVar101;
      auVar70._28_4_ = uVar101;
      uVar19 = vcmpps_avx512vl(local_1060,auVar70,0xd);
      bVar25 = (byte)uVar17 & (byte)uVar19 & bVar25;
      if (bVar25 != 0) {
        uVar37 = vcmpps_avx512vl(auVar71,_DAT_01faff00,4);
        uVar37 = bVar25 & uVar37;
        local_10c0 = (byte)uVar37;
        if (local_10c0 != 0) {
          local_1180 = auVar76;
          local_fe0 = 0xf0;
          auVar21._8_4_ = 0x219392ef;
          auVar21._0_8_ = 0x219392ef219392ef;
          auVar21._12_4_ = 0x219392ef;
          auVar21._16_4_ = 0x219392ef;
          auVar21._20_4_ = 0x219392ef;
          auVar21._24_4_ = 0x219392ef;
          auVar21._28_4_ = 0x219392ef;
          uVar41 = vcmpps_avx512vl(local_1140,auVar21,5);
          auVar70 = vrcp14ps_avx512vl(local_1140);
          auVar98._8_4_ = 0x3f800000;
          auVar98._0_8_ = 0x3f8000003f800000;
          auVar98._12_4_ = 0x3f800000;
          auVar98._16_4_ = 0x3f800000;
          auVar98._20_4_ = 0x3f800000;
          auVar98._24_4_ = 0x3f800000;
          auVar98._28_4_ = 0x3f800000;
          auVar43 = vfnmadd213ps_fma(local_1140,auVar70,auVar98);
          auVar69 = vfmadd132ps_avx512vl(ZEXT1632(auVar43),auVar70,auVar70);
          fVar122 = (float)((uint)((byte)uVar41 & 1) * auVar69._0_4_);
          fVar117 = (float)((uint)((byte)(uVar41 >> 1) & 1) * auVar69._4_4_);
          fVar106 = (float)((uint)((byte)(uVar41 >> 2) & 1) * auVar69._8_4_);
          fVar113 = (float)((uint)((byte)(uVar41 >> 3) & 1) * auVar69._12_4_);
          fVar109 = (float)((uint)((byte)(uVar41 >> 4) & 1) * auVar69._16_4_);
          fVar104 = (float)((uint)((byte)(uVar41 >> 5) & 1) * auVar69._20_4_);
          fVar127 = (float)((uint)((byte)(uVar41 >> 6) & 1) * auVar69._24_4_);
          auVar92._0_4_ = fVar122 * auVar42._0_4_;
          auVar92._4_4_ = fVar117 * auVar42._4_4_;
          auVar92._8_4_ = fVar106 * auVar42._8_4_;
          auVar92._12_4_ = fVar113 * auVar42._12_4_;
          auVar92._16_4_ = fVar109 * 0.0;
          auVar92._20_4_ = fVar104 * 0.0;
          auVar92._24_4_ = fVar127 * 0.0;
          auVar92._28_4_ = 0;
          auVar69 = vminps_avx(auVar92,auVar98);
          auVar22._4_4_ = fVar117 * local_1160._4_4_;
          auVar22._0_4_ = fVar122 * local_1160._0_4_;
          auVar22._8_4_ = fVar106 * local_1160._8_4_;
          auVar22._12_4_ = fVar113 * local_1160._12_4_;
          auVar22._16_4_ = fVar109 * local_1160._16_4_;
          auVar22._20_4_ = fVar104 * local_1160._20_4_;
          auVar22._24_4_ = fVar127 * local_1160._24_4_;
          auVar22._28_4_ = auVar70._28_4_;
          auVar70 = vminps_avx(auVar22,auVar98);
          auVar71 = vsubps_avx(auVar98,auVar69);
          auVar72 = vsubps_avx(auVar98,auVar70);
          local_1080 = vblendps_avx(auVar70,auVar71,0xf0);
          local_10a0 = vblendps_avx(auVar69,auVar72,0xf0);
          fVar117 = (float)DAT_01fef940;
          fVar122 = DAT_01fef940._4_4_;
          fVar127 = DAT_01fef940._8_4_;
          fVar104 = DAT_01fef940._12_4_;
          fVar109 = DAT_01fef940._16_4_;
          fVar113 = DAT_01fef940._20_4_;
          fVar106 = DAT_01fef940._24_4_;
          local_1040[0] = local_1120._0_4_ * fVar117;
          local_1040[1] = local_1120._4_4_ * fVar122;
          local_1040[2] = local_1120._8_4_ * fVar127;
          local_1040[3] = local_1120._12_4_ * fVar104;
          fStack_1030 = local_1120._16_4_ * fVar109;
          fStack_102c = local_1120._20_4_ * fVar113;
          fStack_1028 = local_1120._24_4_ * fVar106;
          uStack_1024 = local_10a0._28_4_;
          local_1020[0] = local_1100._0_4_ * fVar117;
          local_1020[1] = local_1100._4_4_ * fVar122;
          local_1020[2] = local_1100._8_4_ * fVar127;
          local_1020[3] = local_1100._12_4_ * fVar104;
          fStack_1010 = local_1100._16_4_ * fVar109;
          fStack_100c = local_1100._20_4_ * fVar113;
          fStack_1008 = local_1100._24_4_ * fVar106;
          uStack_1004 = local_1100._28_4_;
          local_1000[0] = local_10e0._0_4_ * fVar117;
          local_1000[1] = local_10e0._4_4_ * fVar122;
          local_1000[2] = local_10e0._8_4_ * fVar127;
          local_1000[3] = local_10e0._12_4_ * fVar104;
          fStack_ff0 = local_10e0._16_4_ * fVar109;
          fStack_fec = local_10e0._20_4_ * fVar113;
          fStack_fe8 = local_10e0._24_4_ * fVar106;
          uStack_fe4 = local_10e0._28_4_;
          auVar93._8_4_ = 0x7f800000;
          auVar93._0_8_ = 0x7f8000007f800000;
          auVar93._12_4_ = 0x7f800000;
          auVar93._16_4_ = 0x7f800000;
          auVar93._20_4_ = 0x7f800000;
          auVar93._24_4_ = 0x7f800000;
          auVar93._28_4_ = 0x7f800000;
          auVar69 = vblendmps_avx512vl(auVar93,local_1060);
          auVar89._0_4_ =
               (uint)(local_10c0 & 1) * auVar69._0_4_ | (uint)!(bool)(local_10c0 & 1) * 0x7f800000;
          bVar15 = (bool)((byte)(uVar37 >> 1) & 1);
          auVar89._4_4_ = (uint)bVar15 * auVar69._4_4_ | (uint)!bVar15 * 0x7f800000;
          bVar15 = (bool)((byte)(uVar37 >> 2) & 1);
          auVar89._8_4_ = (uint)bVar15 * auVar69._8_4_ | (uint)!bVar15 * 0x7f800000;
          bVar15 = (bool)((byte)(uVar37 >> 3) & 1);
          auVar89._12_4_ = (uint)bVar15 * auVar69._12_4_ | (uint)!bVar15 * 0x7f800000;
          bVar15 = (bool)((byte)(uVar37 >> 4) & 1);
          auVar89._16_4_ = (uint)bVar15 * auVar69._16_4_ | (uint)!bVar15 * 0x7f800000;
          bVar15 = (bool)((byte)(uVar37 >> 5) & 1);
          auVar89._20_4_ = (uint)bVar15 * auVar69._20_4_ | (uint)!bVar15 * 0x7f800000;
          bVar15 = (bool)((byte)(uVar37 >> 6) & 1);
          auVar89._24_4_ = (uint)bVar15 * auVar69._24_4_ | (uint)!bVar15 * 0x7f800000;
          bVar15 = SUB81(uVar37 >> 7,0);
          auVar89._28_4_ = (uint)bVar15 * auVar69._28_4_ | (uint)!bVar15 * 0x7f800000;
          auVar69 = vshufps_avx(auVar89,auVar89,0xb1);
          auVar69 = vminps_avx(auVar89,auVar69);
          auVar70 = vshufpd_avx(auVar69,auVar69,5);
          auVar69 = vminps_avx(auVar69,auVar70);
          auVar70 = vpermpd_avx2(auVar69,0x4e);
          auVar69 = vminps_avx(auVar69,auVar70);
          uVar17 = vcmpps_avx512vl(auVar89,auVar69,0);
          bVar25 = local_10c0;
          if (((byte)uVar17 & local_10c0) != 0) {
            bVar25 = (byte)uVar17 & local_10c0;
          }
LAB_006e4bd8:
          uVar29 = 0;
          for (uVar30 = (uint)bVar25; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x80000000) {
            uVar29 = uVar29 + 1;
          }
          uVar30 = *(uint *)(local_fc0 + (ulong)uVar29 * 4);
          pGVar6 = (pSVar4->geometries).items[uVar30].ptr;
          if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            uVar37 = (ulong)(byte)(~(byte)(1 << (uVar29 & 0x1f)) & (byte)uVar37);
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              uVar37 = (ulong)(uVar29 << 2);
              uVar101 = *(undefined4 *)(local_10a0 + uVar37);
              uVar2 = *(undefined4 *)(local_1080 + uVar37);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1060 + uVar37);
              *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)((long)local_1040 + uVar37);
              *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)((long)local_1020 + uVar37);
              *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)local_1000 + uVar37);
              *(undefined4 *)(ray + k * 4 + 0xf0) = uVar101;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar2;
              *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(local_1240 + uVar37);
              *(uint *)(ray + k * 4 + 0x120) = uVar30;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              goto LAB_006e5026;
            }
            uVar41 = (ulong)(uVar29 * 4);
            uVar101 = *(undefined4 *)(local_10a0 + uVar41);
            local_11e0._4_4_ = uVar101;
            local_11e0._0_4_ = uVar101;
            local_11e0._8_4_ = uVar101;
            local_11e0._12_4_ = uVar101;
            local_11d0 = *(undefined4 *)(local_1080 + uVar41);
            local_11b0 = vpbroadcastd_avx512vl();
            uVar101 = *(undefined4 *)(local_1240 + uVar41);
            local_11c0._4_4_ = uVar101;
            local_11c0._0_4_ = uVar101;
            local_11c0._8_4_ = uVar101;
            local_11c0._12_4_ = uVar101;
            uVar101 = *(undefined4 *)((long)local_1040 + uVar41);
            uVar2 = *(undefined4 *)((long)local_1020 + uVar41);
            local_1200._4_4_ = uVar2;
            local_1200._0_4_ = uVar2;
            local_1200._8_4_ = uVar2;
            local_1200._12_4_ = uVar2;
            uVar2 = *(undefined4 *)((long)local_1000 + uVar41);
            local_11f0._4_4_ = uVar2;
            local_11f0._0_4_ = uVar2;
            local_11f0._8_4_ = uVar2;
            local_11f0._12_4_ = uVar2;
            local_1210[0] = (RTCHitN)(char)uVar101;
            local_1210[1] = (RTCHitN)(char)((uint)uVar101 >> 8);
            local_1210[2] = (RTCHitN)(char)((uint)uVar101 >> 0x10);
            local_1210[3] = (RTCHitN)(char)((uint)uVar101 >> 0x18);
            local_1210[4] = (RTCHitN)(char)uVar101;
            local_1210[5] = (RTCHitN)(char)((uint)uVar101 >> 8);
            local_1210[6] = (RTCHitN)(char)((uint)uVar101 >> 0x10);
            local_1210[7] = (RTCHitN)(char)((uint)uVar101 >> 0x18);
            local_1210[8] = (RTCHitN)(char)uVar101;
            local_1210[9] = (RTCHitN)(char)((uint)uVar101 >> 8);
            local_1210[10] = (RTCHitN)(char)((uint)uVar101 >> 0x10);
            local_1210[0xb] = (RTCHitN)(char)((uint)uVar101 >> 0x18);
            local_1210[0xc] = (RTCHitN)(char)uVar101;
            local_1210[0xd] = (RTCHitN)(char)((uint)uVar101 >> 8);
            local_1210[0xe] = (RTCHitN)(char)((uint)uVar101 >> 0x10);
            local_1210[0xf] = (RTCHitN)(char)((uint)uVar101 >> 0x18);
            uStack_11cc = local_11d0;
            uStack_11c8 = local_11d0;
            uStack_11c4 = local_11d0;
            vpcmpeqd_avx2(ZEXT1632(local_11e0),ZEXT1632(local_11e0));
            uStack_119c = context->user->instID[0];
            local_11a0 = uStack_119c;
            uStack_1198 = uStack_119c;
            uStack_1194 = uStack_119c;
            uStack_1190 = context->user->instPrimID[0];
            uStack_118c = uStack_1190;
            uStack_1188 = uStack_1190;
            uStack_1184 = uStack_1190;
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1060 + uVar41);
            local_13a0 = local_12d0;
            local_1370.valid = (int *)local_13a0;
            local_1370.geometryUserPtr = pGVar6->userPtr;
            local_1370.context = context->user;
            local_1370.hit = local_1210;
            local_1370.N = 4;
            local_1340 = auVar96._0_32_;
            local_1300 = auVar103._0_32_;
            local_1370.ray = (RTCRayN *)ray;
            if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
              (*pGVar6->intersectionFilterN)(&local_1370);
              auVar103 = ZEXT3264(local_1300);
              auVar96 = ZEXT3264(local_1340);
              auVar133 = ZEXT1664(local_1320);
              auVar132 = ZEXT1664(local_1310);
            }
            uVar41 = vptestmd_avx512vl(local_13a0,local_13a0);
            if ((uVar41 & 0xf) == 0) {
LAB_006e4f41:
              *(int *)(ray + k * 4 + 0x80) = auVar103._0_4_;
            }
            else {
              p_Var9 = context->args->filter;
              if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                (*p_Var9)(&local_1370);
                auVar103 = ZEXT3264(local_1300);
                auVar96 = ZEXT3264(local_1340);
                auVar133 = ZEXT1664(local_1320);
                auVar132 = ZEXT1664(local_1310);
              }
              uVar41 = vptestmd_avx512vl(local_13a0,local_13a0);
              uVar41 = uVar41 & 0xf;
              bVar25 = (byte)uVar41;
              if (bVar25 == 0) goto LAB_006e4f41;
              iVar33 = *(int *)(local_1370.hit + 4);
              iVar23 = *(int *)(local_1370.hit + 8);
              iVar24 = *(int *)(local_1370.hit + 0xc);
              bVar15 = (bool)((byte)(uVar41 >> 1) & 1);
              bVar11 = (bool)((byte)(uVar41 >> 2) & 1);
              bVar14 = SUB81(uVar41 >> 3,0);
              *(uint *)(local_1370.ray + 0xc0) =
                   (uint)(bVar25 & 1) * *(int *)local_1370.hit |
                   (uint)!(bool)(bVar25 & 1) * *(int *)(local_1370.ray + 0xc0);
              *(uint *)(local_1370.ray + 0xc4) =
                   (uint)bVar15 * iVar33 | (uint)!bVar15 * *(int *)(local_1370.ray + 0xc4);
              *(uint *)(local_1370.ray + 200) =
                   (uint)bVar11 * iVar23 | (uint)!bVar11 * *(int *)(local_1370.ray + 200);
              *(uint *)(local_1370.ray + 0xcc) =
                   (uint)bVar14 * iVar24 | (uint)!bVar14 * *(int *)(local_1370.ray + 0xcc);
              iVar33 = *(int *)(local_1370.hit + 0x14);
              iVar23 = *(int *)(local_1370.hit + 0x18);
              iVar24 = *(int *)(local_1370.hit + 0x1c);
              bVar15 = (bool)((byte)(uVar41 >> 1) & 1);
              bVar11 = (bool)((byte)(uVar41 >> 2) & 1);
              bVar14 = SUB81(uVar41 >> 3,0);
              *(uint *)(local_1370.ray + 0xd0) =
                   (uint)(bVar25 & 1) * *(int *)(local_1370.hit + 0x10) |
                   (uint)!(bool)(bVar25 & 1) * *(int *)(local_1370.ray + 0xd0);
              *(uint *)(local_1370.ray + 0xd4) =
                   (uint)bVar15 * iVar33 | (uint)!bVar15 * *(int *)(local_1370.ray + 0xd4);
              *(uint *)(local_1370.ray + 0xd8) =
                   (uint)bVar11 * iVar23 | (uint)!bVar11 * *(int *)(local_1370.ray + 0xd8);
              *(uint *)(local_1370.ray + 0xdc) =
                   (uint)bVar14 * iVar24 | (uint)!bVar14 * *(int *)(local_1370.ray + 0xdc);
              iVar33 = *(int *)(local_1370.hit + 0x24);
              iVar23 = *(int *)(local_1370.hit + 0x28);
              iVar24 = *(int *)(local_1370.hit + 0x2c);
              bVar15 = (bool)((byte)(uVar41 >> 1) & 1);
              bVar11 = (bool)((byte)(uVar41 >> 2) & 1);
              bVar14 = SUB81(uVar41 >> 3,0);
              *(uint *)(local_1370.ray + 0xe0) =
                   (uint)(bVar25 & 1) * *(int *)(local_1370.hit + 0x20) |
                   (uint)!(bool)(bVar25 & 1) * *(int *)(local_1370.ray + 0xe0);
              *(uint *)(local_1370.ray + 0xe4) =
                   (uint)bVar15 * iVar33 | (uint)!bVar15 * *(int *)(local_1370.ray + 0xe4);
              *(uint *)(local_1370.ray + 0xe8) =
                   (uint)bVar11 * iVar23 | (uint)!bVar11 * *(int *)(local_1370.ray + 0xe8);
              *(uint *)(local_1370.ray + 0xec) =
                   (uint)bVar14 * iVar24 | (uint)!bVar14 * *(int *)(local_1370.ray + 0xec);
              iVar33 = *(int *)(local_1370.hit + 0x34);
              iVar23 = *(int *)(local_1370.hit + 0x38);
              iVar24 = *(int *)(local_1370.hit + 0x3c);
              bVar15 = (bool)((byte)(uVar41 >> 1) & 1);
              bVar11 = (bool)((byte)(uVar41 >> 2) & 1);
              bVar14 = SUB81(uVar41 >> 3,0);
              *(uint *)(local_1370.ray + 0xf0) =
                   (uint)(bVar25 & 1) * *(int *)(local_1370.hit + 0x30) |
                   (uint)!(bool)(bVar25 & 1) * *(int *)(local_1370.ray + 0xf0);
              *(uint *)(local_1370.ray + 0xf4) =
                   (uint)bVar15 * iVar33 | (uint)!bVar15 * *(int *)(local_1370.ray + 0xf4);
              *(uint *)(local_1370.ray + 0xf8) =
                   (uint)bVar11 * iVar23 | (uint)!bVar11 * *(int *)(local_1370.ray + 0xf8);
              *(uint *)(local_1370.ray + 0xfc) =
                   (uint)bVar14 * iVar24 | (uint)!bVar14 * *(int *)(local_1370.ray + 0xfc);
              iVar33 = *(int *)(local_1370.hit + 0x44);
              iVar23 = *(int *)(local_1370.hit + 0x48);
              iVar24 = *(int *)(local_1370.hit + 0x4c);
              bVar15 = (bool)((byte)(uVar41 >> 1) & 1);
              bVar11 = (bool)((byte)(uVar41 >> 2) & 1);
              bVar14 = SUB81(uVar41 >> 3,0);
              *(uint *)(local_1370.ray + 0x100) =
                   (uint)(bVar25 & 1) * *(int *)(local_1370.hit + 0x40) |
                   (uint)!(bool)(bVar25 & 1) * *(int *)(local_1370.ray + 0x100);
              *(uint *)(local_1370.ray + 0x104) =
                   (uint)bVar15 * iVar33 | (uint)!bVar15 * *(int *)(local_1370.ray + 0x104);
              *(uint *)(local_1370.ray + 0x108) =
                   (uint)bVar11 * iVar23 | (uint)!bVar11 * *(int *)(local_1370.ray + 0x108);
              *(uint *)(local_1370.ray + 0x10c) =
                   (uint)bVar14 * iVar24 | (uint)!bVar14 * *(int *)(local_1370.ray + 0x10c);
              auVar42 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_1370.hit + 0x50));
              *(undefined1 (*) [16])(local_1370.ray + 0x110) = auVar42;
              auVar42 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_1370.hit + 0x60));
              *(undefined1 (*) [16])(local_1370.ray + 0x120) = auVar42;
              auVar42 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_1370.hit + 0x70));
              *(undefined1 (*) [16])(local_1370.ray + 0x130) = auVar42;
              auVar42 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_1370.hit + 0x80));
              *(undefined1 (*) [16])(local_1370.ray + 0x140) = auVar42;
              auVar103 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
            }
            uVar101 = auVar103._0_4_;
            auVar95._4_4_ = uVar101;
            auVar95._0_4_ = uVar101;
            auVar95._8_4_ = uVar101;
            auVar95._12_4_ = uVar101;
            auVar95._16_4_ = uVar101;
            auVar95._20_4_ = uVar101;
            auVar95._24_4_ = uVar101;
            auVar95._28_4_ = uVar101;
            uVar41 = vcmpps_avx512vl(auVar96._0_32_,auVar95,2);
            uVar37 = (byte)(~(byte)(1 << (uVar29 & 0x1f)) & (byte)uVar37) & uVar41;
          }
          bVar25 = (byte)uVar37;
          if (bVar25 == 0) goto LAB_006e5026;
          auVar94._8_4_ = 0x7f800000;
          auVar94._0_8_ = 0x7f8000007f800000;
          auVar94._12_4_ = 0x7f800000;
          auVar94._16_4_ = 0x7f800000;
          auVar94._20_4_ = 0x7f800000;
          auVar94._24_4_ = 0x7f800000;
          auVar94._28_4_ = 0x7f800000;
          auVar69 = vblendmps_avx512vl(auVar94,auVar96._0_32_);
          auVar90._0_4_ =
               (uint)(bVar25 & 1) * auVar69._0_4_ | (uint)!(bool)(bVar25 & 1) * 0x7f800000;
          bVar15 = (bool)((byte)(uVar37 >> 1) & 1);
          auVar90._4_4_ = (uint)bVar15 * auVar69._4_4_ | (uint)!bVar15 * 0x7f800000;
          bVar15 = (bool)((byte)(uVar37 >> 2) & 1);
          auVar90._8_4_ = (uint)bVar15 * auVar69._8_4_ | (uint)!bVar15 * 0x7f800000;
          bVar15 = (bool)((byte)(uVar37 >> 3) & 1);
          auVar90._12_4_ = (uint)bVar15 * auVar69._12_4_ | (uint)!bVar15 * 0x7f800000;
          bVar15 = (bool)((byte)(uVar37 >> 4) & 1);
          auVar90._16_4_ = (uint)bVar15 * auVar69._16_4_ | (uint)!bVar15 * 0x7f800000;
          bVar15 = (bool)((byte)(uVar37 >> 5) & 1);
          auVar90._20_4_ = (uint)bVar15 * auVar69._20_4_ | (uint)!bVar15 * 0x7f800000;
          bVar15 = (bool)((byte)(uVar37 >> 6) & 1);
          auVar90._24_4_ = (uint)bVar15 * auVar69._24_4_ | (uint)!bVar15 * 0x7f800000;
          bVar15 = SUB81(uVar37 >> 7,0);
          auVar90._28_4_ = (uint)bVar15 * auVar69._28_4_ | (uint)!bVar15 * 0x7f800000;
          auVar69 = vshufps_avx(auVar90,auVar90,0xb1);
          auVar69 = vminps_avx(auVar90,auVar69);
          auVar70 = vshufpd_avx(auVar69,auVar69,5);
          auVar69 = vminps_avx(auVar69,auVar70);
          auVar70 = vpermpd_avx2(auVar69,0x4e);
          auVar69 = vminps_avx(auVar69,auVar70);
          uVar17 = vcmpps_avx512vl(auVar90,auVar69,0);
          bVar28 = (byte)uVar17 & bVar25;
          if (bVar28 != 0) {
            bVar25 = bVar28;
          }
          goto LAB_006e4bd8;
        }
      }
    }
LAB_006e5026:
    local_1388 = local_1388 + 1;
  } while (local_1388 != local_1390);
LAB_006e5039:
  uVar101 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar96 = ZEXT1664(CONCAT412(uVar101,CONCAT48(uVar101,CONCAT44(uVar101,uVar101))));
  auVar103 = ZEXT1664(local_1250);
  auVar131 = ZEXT1664(local_12c0);
  fVar104 = local_1260;
  fVar106 = fStack_125c;
  fVar107 = fStack_1258;
  fVar108 = fStack_1254;
  fVar109 = local_1270;
  fVar110 = fStack_126c;
  fVar111 = fStack_1268;
  fVar112 = fStack_1264;
  fVar113 = local_1280;
  fVar114 = fStack_127c;
  fVar115 = fStack_1278;
  fVar116 = fStack_1274;
  fVar117 = local_1290;
  fVar119 = fStack_128c;
  fVar120 = fStack_1288;
  fVar121 = fStack_1284;
  fVar122 = local_12a0;
  fVar124 = fStack_129c;
  fVar125 = fStack_1298;
  fVar126 = fStack_1294;
  fVar127 = local_12b0;
  fVar128 = fStack_12ac;
  fVar129 = fStack_12a8;
  fVar130 = fStack_12a4;
LAB_006e508f:
  if (puVar26 == &local_fa0) {
    return;
  }
  goto LAB_006e3fd7;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }